

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O2

Aig_Man_t * Fra_ManPrepareComb(Fra_Man_t *p)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *p_00;
  Aig_Man_t *p_01;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t **ppVVar5;
  int *piVar6;
  int iVar7;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraMan.c"
                  ,0xb5,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
  }
  p_01 = Aig_ManStart(p->pManAig->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pManAig->pName);
  p_01->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pManAig->pSpec);
  p_01->pSpec = pcVar2;
  pAVar1 = p->pManAig;
  p_01->nRegs = pAVar1->nRegs;
  p_01->nAsserts = pAVar1->nAsserts;
  pvVar3 = (pAVar1->pConst1->field_5).pData;
  *(Aig_Obj_t **)
   (*(long *)((long)pvVar3 + 0x20) +
   (long)pAVar1->pConst1->Id * (long)*(int *)((long)pvVar3 + 0x18) * 8) = p_01->pConst1;
  for (iVar7 = 0; p_00 = p->pManAig->vCis, iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(p_00,iVar7);
    pAVar4 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)
     (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) +
     (long)*(int *)((long)pvVar3 + 0x24) * (long)*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) * 8
     ) = pAVar4;
  }
  for (iVar7 = 0; iVar7 < p_01->vObjs->nSize; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(p_01->vObjs,iVar7);
    if (pvVar3 != (void *)0x0) {
      *(Fra_Man_t **)((long)pvVar3 + 0x28) = p;
    }
  }
  iVar7 = p->nSizeAlloc;
  p->nMemAlloc = iVar7;
  ppVVar5 = (Vec_Ptr_t **)calloc(1,(long)iVar7 * 8);
  p->pMemFanins = ppVVar5;
  piVar6 = (int *)calloc(1,(long)iVar7 << 2);
  p->pMemSatNums = piVar6;
  if (p_01->pData == (void *)0x0) {
    return p_01;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraMan.c"
                ,0xca,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_ManPrepareComb( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pManFraig == NULL );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs    = p->pManAig->nRegs;
    pManFraig->nAsserts = p->pManAig->nAsserts;
    // set the pointers to the available fraig nodes
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), 0, Aig_ManConst1(pManFraig) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );
    // set the pointers to the manager
    Aig_ManForEachObj( pManFraig, pObj, i )
        pObj->pData = p;
    // allocate memory for mapping FRAIG nodes into SAT numbers and fanins
    p->nMemAlloc = p->nSizeAlloc;
    p->pMemFanins = ABC_ALLOC( Vec_Ptr_t *, p->nMemAlloc );
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    p->pMemSatNums = ABC_ALLOC( int, p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}